

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastV8R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  RepeatedField<bool> *this;
  ParseContext *pPVar1;
  byte *pbVar2;
  MessageLite *pMVar3;
  uint64_t uVar4;
  TcParseTableBase *this_00;
  bool bVar5;
  unsigned_short uVar6;
  uint16_t uVar7;
  uint uVar8;
  char *pcVar9;
  uint *puVar10;
  ulong uVar11;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  bool local_221;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_1c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1b8;
  byte local_1ab;
  unsigned_short local_1aa;
  bool tmp;
  RepeatedField<bool> *pRStack_1a8;
  unsigned_short expected_tag;
  RepeatedField<bool> *field;
  uint64_t local_198;
  TcParseTableBase *local_190;
  ParseContext *local_188;
  byte *local_180;
  MessageLite *local_178;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_170;
  TcFieldData local_168;
  TcFieldData local_160;
  undefined1 local_151;
  uint64_t uStack_150;
  bool always_return;
  TcParseTableBase *local_148;
  ParseContext *local_140;
  byte *local_138;
  MessageLite *local_130;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_128;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_120;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_118;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  byte local_21;
  uchar byte;
  byte *local_18;
  byte *local_10;
  
  local_198 = hasbits;
  local_190 = table;
  local_188 = ctx;
  local_180 = (byte *)ptr;
  local_178 = msg;
  local_170 = data.field_0;
  uVar6 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&local_170);
  pMVar3 = local_178;
  pbVar2 = local_180;
  pPVar1 = local_188;
  if (uVar6 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&field);
    pcVar9 = MiniParse(pMVar3,(char *)pbVar2,pPVar1,(TcFieldData)field,local_190,local_198);
    return pcVar9;
  }
  uVar7 = TcFieldData::offset((TcFieldData *)&local_170);
  pRStack_1a8 = RefAt<google::protobuf::RepeatedField<bool>>(pMVar3,(ulong)uVar7);
  local_1aa = UnalignedLoad<unsigned_short>((char *)local_180);
  do {
    pMVar3 = local_178;
    pPVar1 = local_188;
    this = pRStack_1a8;
    local_10 = local_180 + 3;
    local_21 = local_180[2];
    local_221 = 1 < local_21;
    if (local_221) {
      local_18 = local_10;
      if ((local_21 & 0x80) != 0) {
        local_21 = local_21 + 0x80 | *local_10;
        local_18 = local_180 + 4;
        if ((local_21 & 0x80) != 0) {
          local_21 = local_21 + 0x80 | local_180[4];
          local_18 = local_180 + 5;
          if ((local_21 & 0x80) != 0) {
            local_21 = local_21 + 0x80 | local_180[5];
            local_18 = local_180 + 6;
            if ((local_21 & 0x80) != 0) {
              local_21 = local_21 + 0x80 | local_180[6];
              local_18 = local_180 + 7;
              if ((local_21 & 0x80) != 0) {
                local_21 = local_21 + 0x80 | local_180[7];
                local_18 = local_180 + 8;
                if ((local_21 & 0x80) != 0) {
                  local_21 = local_21 + 0x80 | local_180[8];
                  local_18 = local_180 + 9;
                  if ((local_21 & 0x80) != 0) {
                    local_21 = local_21 + 0x80 | local_180[9];
                    local_18 = local_180 + 10;
                    if ((local_21 & 0x80) != 0) {
                      local_21 = local_21 + 0x80 | local_180[10];
                      local_18 = local_180 + 0xb;
                      if ((local_21 & 0x80) != 0) {
                        local_18 = local_180 + 0xc;
                        local_21 = local_21 + 0x80 | local_180[0xb] & 0x81;
                        if ((local_21 & 0x80) != 0) {
                          local_10 = (byte *)0x0;
                          local_21 = local_1ab;
                          goto LAB_0079b3fe;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_10 = local_18;
      local_21 = local_21 != 0;
    }
LAB_0079b3fe:
    local_1ab = local_21;
    local_180 = local_10;
    if (local_10 == (byte *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_1b8);
      pcVar9 = Error(pMVar3,(char *)0x0,pPVar1,(TcFieldData)local_1b8,local_190,local_198);
      return pcVar9;
    }
    bVar5 = internal::(anonymous_namespace)::ZigZagDecodeHelper<bool,false>((bool)(local_1ab & 1));
    RepeatedField<bool>::Add(this,bVar5);
    bVar5 = EpsCopyInputStream::DataAvailable
                      (&local_188->super_EpsCopyInputStream,(char *)local_180);
    pMVar3 = local_178;
    pbVar2 = local_180;
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_1c0);
      if (local_190->has_bits_offset != 0) {
        uVar8 = (uint)local_198;
        puVar10 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_190->has_bits_offset);
        *puVar10 = uVar8 | *puVar10;
      }
      return (char *)pbVar2;
    }
    uVar6 = UnalignedLoad<unsigned_short>((char *)local_180);
    local_130 = local_178;
    local_138 = local_180;
    local_140 = local_188;
    if (uVar6 != local_1aa) {
      TcFieldData::TcFieldData(&data_local);
      local_128 = data_local.field_0;
      local_148 = local_190;
      uStack_150 = local_198;
      local_151 = 0;
      bVar5 = EpsCopyInputStream::DataAvailable
                        (&local_140->super_EpsCopyInputStream,(char *)local_138);
      pMVar3 = local_130;
      pbVar2 = local_138;
      pPVar1 = local_140;
      if (!bVar5) {
        TcFieldData::TcFieldData(&local_160);
        if (local_148->has_bits_offset != 0) {
          uVar8 = (uint)uStack_150;
          puVar10 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_148->has_bits_offset);
          *puVar10 = uVar8 | *puVar10;
        }
        return (char *)pbVar2;
      }
      TcFieldData::TcFieldData(&local_168);
      this_00 = local_148;
      uVar4 = uStack_150;
      uVar6 = UnalignedLoad<unsigned_short>((char *)pbVar2);
      uVar11 = (ulong)(int)((uint)uVar6 & (uint)this_00->fast_idx_mask);
      if ((uVar11 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry(this_00,uVar11 >> 3);
      local_118.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar6;
      UNRECOVERED_JUMPTABLE =
           TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_120.data = local_118.data;
      pcVar9 = (*UNRECOVERED_JUMPTABLE)
                         (pMVar3,(char *)pbVar2,pPVar1,(TcFieldData)local_118,this_00,uVar4);
      return pcVar9;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<bool, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}